

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.cpp
# Opt level: O2

size_t __thiscall groundupdbext::HighwayHash::operator()(HighwayHash *this,Bytes *data)

{
  pointer bytes;
  
  highwayhash::HighwayHashCatT<1U>::Reset(this->m_hh,this->m_key);
  for (bytes = (data->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bytes != (data->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
               super__Vector_impl_data._M_finish; bytes = bytes + 1) {
    highwayhash::HighwayHashCatT<1U>::Append(this->m_hh,(char *)bytes,1);
  }
  highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>(this->m_hh,this->m_result);
  return *this->m_result;
}

Assistant:

std::size_t
HighwayHash::operator() (const groundupdb::Bytes& data) const noexcept {
  m_hh->Reset(m_key);
  for (auto iter = data.begin();iter != data.end();++iter) {
    m_hh->Append((const char*)&*iter,sizeof(*iter));
  }
  m_hh->Finalize(m_result);
  return *m_result;
}